

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

void __thiscall
iutest::detail::ElementsAreArrayMatcher<int>::~ElementsAreArrayMatcher
          (ElementsAreArrayMatcher<int> *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_expected).super__Vector_base<int,_std::allocator<int>_>);
  operator_delete(this,0x28);
  return;
}

Assistant:

class ElementsAreArrayMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    template<typename It>
    ElementsAreArrayMatcher(It begin, It end, bool expected_elem_count=true)
        : m_expected_elem_count(expected_elem_count)
    {
        m_expected.insert(m_expected.end(), begin, end);
    }

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        IUTEST_USING_BEGIN_END();
        return Check(begin(actual), end(actual));
    }

public:
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        return WhichIs(PrintToString(m_expected));
    }